

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec2d.cpp
# Opt level: O0

Vec2d * __thiscall Vec2d::getRotation(Vec2d *this,Vec2d *rotationPoint,float angle)

{
  Vec2d *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  float ynew;
  float xnew;
  float rotationY;
  float rotationX;
  float c;
  float s;
  float angle_local;
  Vec2d *rotationPoint_local;
  Vec2d *this_local;
  
  dVar5 = std::sin((double)(ulong)(uint)angle);
  dVar5 = std::round(dVar5);
  dVar6 = std::cos((double)(ulong)(uint)angle);
  dVar6 = std::round(dVar6);
  fVar2 = this->x;
  fVar1 = getX(rotationPoint);
  fVar2 = fVar2 - fVar1;
  fVar1 = this->y;
  fVar3 = getY(rotationPoint);
  fVar1 = fVar1 - fVar3;
  this_00 = (Vec2d *)operator_new(8);
  fVar3 = getX(rotationPoint);
  fVar4 = getY(rotationPoint);
  Vec2d(this_00,(fVar2 * SUB84(dVar6,0) - fVar1 * SUB84(dVar5,0)) + fVar3,
        fVar1 * SUB84(dVar6,0) + fVar2 * SUB84(dVar5,0) + fVar4);
  return this_00;
}

Assistant:

Vec2d* Vec2d::getRotation(Vec2d* rotationPoint, float angle) {
    float s = round(sin(angle));
    float c = round(cos(angle));
    
    // translate point back to origin:
    float rotationX = x - rotationPoint->getX();
    float rotationY = y - rotationPoint->getY();
    
    float xnew = rotationX * c - rotationY * s;
    float ynew = rotationY * c + rotationX * s;
    
    // translate point back:
    return new Vec2d(xnew + rotationPoint->getX(), ynew + rotationPoint->getY());
}